

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

bool lest::search(text *part,text *line)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  int __c;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  
  pcVar12 = (line->_M_dataplus)._M_p;
  uVar3 = line->_M_string_length;
  sVar4 = part->_M_string_length;
  if (sVar4 == 0 || uVar3 == 0) goto LAB_00107da8;
  pcVar1 = pcVar12 + uVar3;
  pcVar5 = (part->_M_dataplus)._M_p;
  pcVar13 = pcVar12;
  if (0 < (long)uVar3 >> 2) {
    iVar8 = tolower((int)*pcVar5);
    pcVar13 = pcVar12 + (uVar3 & 0xfffffffffffffffc);
    lVar11 = ((long)uVar3 >> 2) + 1;
    pcVar10 = pcVar12 + 3;
    do {
      iVar9 = tolower((int)pcVar10[-3]);
      if (iVar9 == iVar8) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00107bff;
      }
      iVar9 = tolower((int)pcVar10[-2]);
      if (iVar9 == iVar8) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00107bff;
      }
      iVar9 = tolower((int)pcVar10[-1]);
      if (iVar9 == iVar8) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00107bff;
      }
      iVar9 = tolower((int)*pcVar10);
      if (iVar9 == iVar8) goto LAB_00107bff;
      lVar11 = lVar11 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar11);
  }
  lVar11 = (long)pcVar1 - (long)pcVar13;
  if (lVar11 == 3) {
    __c = (int)*pcVar5;
    iVar8 = tolower((int)*pcVar13);
    iVar9 = tolower(__c);
    pcVar10 = pcVar13;
    if (iVar8 != iVar9) {
      pcVar13 = pcVar13 + 1;
      goto LAB_00107bc5;
    }
  }
  else {
    if (lVar11 == 2) {
      __c = (int)*pcVar5;
LAB_00107bc5:
      iVar8 = tolower((int)*pcVar13);
      iVar9 = tolower(__c);
      pcVar10 = pcVar13;
      if (iVar8 == iVar9) goto LAB_00107bff;
      pcVar13 = pcVar13 + 1;
    }
    else {
      pcVar10 = pcVar1;
      if (lVar11 != 1) goto LAB_00107bff;
      __c = (int)*pcVar5;
    }
    iVar8 = tolower((int)*pcVar13);
    iVar9 = tolower(__c);
    pcVar10 = pcVar13;
    if (iVar8 != iVar9) {
      pcVar10 = pcVar1;
    }
  }
LAB_00107bff:
  pcVar12 = pcVar10;
  if ((sVar4 != 1) && (pcVar12 = pcVar1, pcVar10 != pcVar1)) {
    do {
      pcVar13 = pcVar10 + 1;
      pcVar12 = pcVar1;
      if (pcVar13 == pcVar1) break;
      lVar11 = 1;
      while( true ) {
        cVar2 = pcVar5[lVar11];
        iVar8 = tolower((int)pcVar10[lVar11]);
        iVar9 = tolower((int)cVar2);
        if (iVar8 != iVar9) break;
        pcVar12 = pcVar10;
        if (((2 - sVar4) + lVar11 == 1) ||
           (lVar6 = lVar11 + 1, lVar11 = lVar11 + 1, pcVar12 = pcVar1, pcVar10 + lVar6 == pcVar1))
        goto LAB_00107da8;
      }
      lVar11 = (long)pcVar1 - (long)pcVar13 >> 2;
      if (0 < lVar11) {
        iVar8 = tolower((int)*pcVar5);
        pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar13 & 0xfffffffffffffffc);
        lVar11 = lVar11 + 1;
        do {
          pcVar12 = pcVar10 + 4;
          iVar9 = tolower((int)pcVar10[1]);
          if (iVar9 == iVar8) {
            pcVar10 = pcVar10 + 1;
            goto LAB_00107d97;
          }
          iVar9 = tolower((int)pcVar10[2]);
          if (iVar9 == iVar8) {
            pcVar10 = pcVar10 + 2;
            goto LAB_00107d97;
          }
          iVar9 = tolower((int)pcVar10[3]);
          if (iVar9 == iVar8) {
            pcVar10 = pcVar10 + 3;
            goto LAB_00107d97;
          }
          iVar9 = tolower((int)*pcVar12);
          pcVar10 = pcVar12;
          if (iVar9 == iVar8) goto LAB_00107d97;
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
      }
      lVar11 = (long)pcVar1 - (long)pcVar13;
      if (lVar11 == 1) {
LAB_00107d5b:
        cVar2 = *pcVar5;
        iVar8 = tolower((int)*pcVar13);
        iVar9 = tolower((int)cVar2);
        pcVar10 = pcVar13;
        if (iVar8 != iVar9) {
          pcVar10 = pcVar1;
        }
      }
      else if (lVar11 == 2) {
LAB_00107d48:
        bVar7 = case_insensitive_equal(*pcVar13,*pcVar5);
        pcVar10 = pcVar13;
        if (!bVar7) {
          pcVar13 = pcVar13 + 1;
          goto LAB_00107d5b;
        }
      }
      else {
        pcVar12 = pcVar1;
        if (lVar11 != 3) break;
        bVar7 = case_insensitive_equal(*pcVar13,*pcVar5);
        pcVar10 = pcVar13;
        if (!bVar7) {
          pcVar13 = pcVar13 + 1;
          goto LAB_00107d48;
        }
      }
LAB_00107d97:
      pcVar12 = pcVar1;
    } while (pcVar10 != pcVar1);
  }
LAB_00107da8:
  return pcVar12 != (line->_M_dataplus)._M_p + line->_M_string_length;
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }